

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

string * __thiscall
TestNLHandler::MakeVarArg
          (string *__return_storage_ptr__,TestNLHandler *this,string *op,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  char *pcVar1;
  pointer __src;
  ulong size;
  char *pcVar2;
  Buffer<char> *pBVar3;
  size_t sVar4;
  char *str;
  size_t new_size;
  MemoryWriter w;
  Writer local_258;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> local_248;
  
  local_258.buffer_ = &local_248.super_Buffer<char>;
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_002ee180;
  pcVar1 = local_248.data_;
  local_248.super_Buffer<char>.size_ = 0;
  local_248.super_Buffer<char>.capacity_ = 500;
  local_248.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002ee1c8;
  __src = (op->_M_dataplus)._M_p;
  size = op->_M_string_length;
  local_248.super_Buffer<char>.ptr_ = pcVar1;
  if (size < 0x1f5) {
    if (size == 0) goto LAB_001b0fb1;
  }
  else {
    fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::grow
              ((MemoryBuffer<char,_500UL,_std::allocator<char>_> *)local_258.buffer_,size);
  }
  memmove(local_248.super_Buffer<char>.ptr_ + local_248.super_Buffer<char>.size_,__src,size);
LAB_001b0fb1:
  pBVar3 = local_258.buffer_;
  sVar4 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->size_;
  local_248.super_Buffer<char>.size_ = size;
  if (sVar4 == ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->capacity_) {
    (**((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->_vptr_Buffer)
              (local_258.buffer_,sVar4 + 1);
    sVar4 = ((Buffer<char> *)&pBVar3->_vptr_Buffer)->size_;
  }
  ((Buffer<char> *)&pBVar3->_vptr_Buffer)->size_ = sVar4 + 1;
  ((Buffer<char> *)&pBVar3->_vptr_Buffer)->ptr_[sVar4] = '(';
  WriteList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(&local_258,args)
  ;
  pBVar3 = local_258.buffer_;
  sVar4 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->size_;
  if (sVar4 == ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->capacity_) {
    (**((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->_vptr_Buffer)
              (local_258.buffer_,sVar4 + 1);
    sVar4 = ((Buffer<char> *)&pBVar3->_vptr_Buffer)->size_;
  }
  ((Buffer<char> *)&pBVar3->_vptr_Buffer)->size_ = sVar4 + 1;
  ((Buffer<char> *)&pBVar3->_vptr_Buffer)->ptr_[sVar4] = ')';
  pcVar2 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->ptr_;
  sVar4 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->size_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar4);
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_002ee180;
  local_248.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002ee1c8;
  if (local_248.super_Buffer<char>.ptr_ != pcVar1) {
    operator_delete(local_248.super_Buffer<char>.ptr_,local_248.super_Buffer<char>.capacity_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MakeVarArg(std::string op, const std::vector<std::string> &args) {
    fmt::MemoryWriter w;
    w << op << '(';
    WriteList(w, args);
    w << ')';
    return w.str();
  }